

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall Assimp::FBX::FBXConverter::ConvertGlobalSettings(FBXConverter *this)

{
  aiMetadata *paVar1;
  FileGlobalSettings *pFVar2;
  uint64_t uVar3;
  float fVar4;
  allocator<char> local_41;
  string local_40;
  aiVector3D local_20;
  
  if (this->out != (aiScene *)0x0) {
    paVar1 = aiMetadata::Alloc(0xf);
    this->out->mMetaData = paVar1;
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"UpAxis",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_20.x = (float)FileGlobalSettings::UpAxis(pFVar2);
    aiMetadata::Set<int>(paVar1,0,&local_40,(int *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"UpAxisSign",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_20.x = (float)FileGlobalSettings::UpAxisSign(pFVar2);
    aiMetadata::Set<int>(paVar1,1,&local_40,(int *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"FrontAxis",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_20.x = (float)FileGlobalSettings::FrontAxis(pFVar2);
    aiMetadata::Set<int>(paVar1,2,&local_40,(int *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"FrontAxisSign",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_20.x = (float)FileGlobalSettings::FrontAxisSign(pFVar2);
    aiMetadata::Set<int>(paVar1,3,&local_40,(int *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"CoordAxis",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_20.x = (float)FileGlobalSettings::CoordAxis(pFVar2);
    aiMetadata::Set<int>(paVar1,4,&local_40,(int *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CoordAxisSign",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_20.x = (float)FileGlobalSettings::CoordAxisSign(pFVar2);
    aiMetadata::Set<int>(paVar1,5,&local_40,(int *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"OriginalUpAxis",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_20.x = (float)FileGlobalSettings::OriginalUpAxis(pFVar2);
    aiMetadata::Set<int>(paVar1,6,&local_40,(int *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"OriginalUpAxisSign",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_20.x = (float)FileGlobalSettings::OriginalUpAxisSign(pFVar2);
    aiMetadata::Set<int>(paVar1,7,&local_40,(int *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"UnitScaleFactor",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    fVar4 = FileGlobalSettings::UnitScaleFactor(pFVar2);
    local_20._0_8_ = (double)fVar4;
    aiMetadata::Set<double>(paVar1,8,&local_40,(double *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"OriginalUnitScaleFactor",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    fVar4 = FileGlobalSettings::OriginalUnitScaleFactor(pFVar2);
    local_20.x = fVar4;
    aiMetadata::Set<float>(paVar1,9,&local_40,&local_20.x);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"AmbientColor",&local_41)
    ;
    pFVar2 = Document::GlobalSettings(this->doc);
    local_20 = FileGlobalSettings::AmbientColor(pFVar2);
    aiMetadata::Set<aiVector3t<float>>(paVar1,10,&local_40,&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"FrameRate",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    fVar4 = (float)FileGlobalSettings::TimeMode(pFVar2);
    local_20.x = fVar4;
    aiMetadata::Set<int>(paVar1,0xb,&local_40,(int *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"TimeSpanStart",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    uVar3 = FileGlobalSettings::TimeSpanStart(pFVar2);
    local_20._0_8_ = uVar3;
    aiMetadata::Set<unsigned_long>(paVar1,0xc,&local_40,(unsigned_long *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"TimeSpanStop",&local_41)
    ;
    pFVar2 = Document::GlobalSettings(this->doc);
    uVar3 = FileGlobalSettings::TimeSpanStop(pFVar2);
    local_20.x = (float)(int)uVar3;
    local_20.y = (float)(int)(uVar3 >> 0x20);
    aiMetadata::Set<unsigned_long>(paVar1,0xd,&local_40,(unsigned_long *)&local_20);
    std::__cxx11::string::~string((string *)&local_40);
    paVar1 = this->out->mMetaData;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CustomFrameRate",&local_41);
    pFVar2 = Document::GlobalSettings(this->doc);
    fVar4 = FileGlobalSettings::CustomFrameRate(pFVar2);
    local_20.x = fVar4;
    aiMetadata::Set<float>(paVar1,0xe,&local_40,&local_20.x);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void FBXConverter::ConvertGlobalSettings() {
            if (nullptr == out) {
                return;
            }

            out->mMetaData = aiMetadata::Alloc(15);
            out->mMetaData->Set(0, "UpAxis", doc.GlobalSettings().UpAxis());
            out->mMetaData->Set(1, "UpAxisSign", doc.GlobalSettings().UpAxisSign());
            out->mMetaData->Set(2, "FrontAxis", doc.GlobalSettings().FrontAxis());
            out->mMetaData->Set(3, "FrontAxisSign", doc.GlobalSettings().FrontAxisSign());
            out->mMetaData->Set(4, "CoordAxis", doc.GlobalSettings().CoordAxis());
            out->mMetaData->Set(5, "CoordAxisSign", doc.GlobalSettings().CoordAxisSign());
            out->mMetaData->Set(6, "OriginalUpAxis", doc.GlobalSettings().OriginalUpAxis());
            out->mMetaData->Set(7, "OriginalUpAxisSign", doc.GlobalSettings().OriginalUpAxisSign());
            out->mMetaData->Set(8, "UnitScaleFactor", (double)doc.GlobalSettings().UnitScaleFactor());
            out->mMetaData->Set(9, "OriginalUnitScaleFactor", doc.GlobalSettings().OriginalUnitScaleFactor());
            out->mMetaData->Set(10, "AmbientColor", doc.GlobalSettings().AmbientColor());
            out->mMetaData->Set(11, "FrameRate", (int)doc.GlobalSettings().TimeMode());
            out->mMetaData->Set(12, "TimeSpanStart", doc.GlobalSettings().TimeSpanStart());
            out->mMetaData->Set(13, "TimeSpanStop", doc.GlobalSettings().TimeSpanStop());
            out->mMetaData->Set(14, "CustomFrameRate", doc.GlobalSettings().CustomFrameRate());
        }